

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoderTest_test_decode_string_field_Test::
PriceUpdateDecoderTest_test_decode_string_field_Test
          (PriceUpdateDecoderTest_test_decode_string_field_Test *this)

{
  PriceUpdateDecoderTest_test_decode_string_field_Test *this_local;
  
  PriceUpdateDecoderTest::PriceUpdateDecoderTest(&this->super_PriceUpdateDecoderTest);
  (this->super_PriceUpdateDecoderTest).super_Test._vptr_Test =
       (_func_int **)&PTR__PriceUpdateDecoderTest_test_decode_string_field_Test_003d8c68;
  return;
}

Assistant:

TEST_F(PriceUpdateDecoderTest, test_decode_string_field)
{
    std::string value = "this is certainly a string";
    Varint::WriteString(buffer, value);
    FieldDef field_def = FieldDef(1, FieldTypeEnum::STRING, "field");
    PriceField field = PriceUpdateDecoder::DecodeField(buffer, field_def);
    EXPECT_EQ(PriceField::STRING, field.GetType());
    EXPECT_EQ(value, field.GetString());
}